

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O0

void dumpeasysrc(GlobalConfig *config)

{
  char *__s1;
  int iVar1;
  char *c;
  int i;
  _Bool fopened;
  FILE *out;
  char *o;
  curl_slist *ptr;
  GlobalConfig *config_local;
  
  __s1 = config->libcurl;
  iVar1 = strcmp(__s1,"-");
  if (iVar1 == 0) {
    _i = _stdout;
  }
  else {
    _i = fopen64(__s1,"w");
  }
  c._7_1_ = iVar1 != 0;
  if (_i == (FILE *)0x0) {
    warnf(config,"Failed to open %s to write libcurl code!\n",__s1);
  }
  else {
    for (c._0_4_ = 0; srchead[(int)c] != (char *)0x0; c._0_4_ = (int)c + 1) {
      curl_mfprintf(_i,"%s\n",srchead[(int)c]);
    }
    if (easysrc_decl != (slist_wc *)0x0) {
      for (o = (char *)easysrc_decl->first; o != (char *)0x0; o = *(char **)(o + 8)) {
        curl_mfprintf(_i,"  %s\n",*(undefined8 *)o);
      }
    }
    if (easysrc_data != (slist_wc *)0x0) {
      curl_mfprintf(_i,"\n");
      for (o = (char *)easysrc_data->first; o != (char *)0x0; o = *(char **)(o + 8)) {
        curl_mfprintf(_i,"  %s\n",*(undefined8 *)o);
      }
    }
    curl_mfprintf(_i,"\n");
    if (easysrc_code != (slist_wc *)0x0) {
      for (o = (char *)easysrc_code->first; o != (char *)0x0; o = *(char **)(o + 8)) {
        if (**(char **)o == '\0') {
          curl_mfprintf(_i,"\n");
        }
        else {
          curl_mfprintf(_i,"  %s\n",*(undefined8 *)o);
        }
      }
    }
    if (easysrc_clean != (slist_wc *)0x0) {
      for (o = (char *)easysrc_clean->first; o != (char *)0x0; o = *(char **)(o + 8)) {
        curl_mfprintf(_i,"  %s\n",*(undefined8 *)o);
      }
    }
    for (c._0_4_ = 0; srcend[(int)c] != (char *)0x0; c._0_4_ = (int)c + 1) {
      curl_mfprintf(_i,"%s\n",srcend[(int)c]);
    }
    if (c._7_1_) {
      fclose(_i);
    }
  }
  easysrc_free();
  return;
}

Assistant:

void dumpeasysrc(struct GlobalConfig *config)
{
  struct curl_slist *ptr;
  char *o = config->libcurl;

  FILE *out;
  bool fopened = FALSE;
  if(strcmp(o, "-")) {
    out = fopen(o, FOPEN_WRITETEXT);
    fopened = TRUE;
  }
  else
    out = stdout;
  if(!out)
    warnf(config, "Failed to open %s to write libcurl code!\n", o);
  else {
    int i;
    const char *c;

    for(i = 0; ((c = srchead[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    /* Declare variables used for complex setopt values */
    if(easysrc_decl) {
      for(ptr = easysrc_decl->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    /* Set up complex values for setopt calls */
    if(easysrc_data) {
      fprintf(out, "\n");

      for(ptr = easysrc_data->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    fprintf(out, "\n");
    if(easysrc_code) {
      for(ptr = easysrc_code->first; ptr; ptr = ptr->next) {
        if(ptr->data[0]) {
          fprintf(out, "  %s\n", ptr->data);
        }
        else {
          fprintf(out, "\n");
        }
      }
    }

    if(easysrc_clean) {
      for(ptr = easysrc_clean->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    for(i = 0; ((c = srcend[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    if(fopened)
      fclose(out);
  }

  easysrc_free();
}